

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O2

void __thiscall geometrycentral::DisjointSets::merge(DisjointSets *this,size_t x,size_t y)

{
  pointer puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar3 = find(this,x);
  sVar4 = find(this,y);
  puVar1 = (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar5 = sVar4;
  sVar2 = sVar3;
  if (puVar1[sVar4] < puVar1[sVar3]) {
    sVar5 = sVar3;
    sVar2 = sVar4;
  }
  (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar2] = sVar5;
  if (puVar1[sVar3] == puVar1[sVar4]) {
    puVar1[sVar4] = puVar1[sVar3] + 1;
  }
  return;
}

Assistant:

void DisjointSets::merge(size_t x, size_t y) {
  x = find(x);
  y = find(y);

  // Smaller tree becomes a subtree of the larger tree
  if (rank[x] > rank[y])
    parent[y] = x;
  else
    parent[x] = y;

  if (rank[x] == rank[y]) rank[y]++;
}